

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O0

bool __thiscall VL53L0X::setMeasurementTimingBudget(VL53L0X *this,uint32_t budgetMicroseconds)

{
  uint16_t value;
  uint32_t uVar1;
  uint16_t local_5a;
  uint uStack_54;
  uint16_t finalRangeTimeoutMCLKs;
  uint32_t finalRangeTimeoutMicroseconds;
  uint32_t usedBudgetMicroseconds;
  VL53L0XSequenceStepTimeouts timeouts;
  VL53L0XSequenceStepEnables enables;
  uint32_t MIN_TIMING_BUDGET;
  uint16_t FINAL_RANGE_OVERHEAD;
  uint16_t PRE_RANGE_OVERHEAD;
  uint16_t DSS_OVERHEAD;
  uint16_t TCC_OVERHEAD;
  uint16_t MSRC_OVERHEAD;
  uint16_t END_OVERHEAD;
  uint16_t START_OVERHEAD;
  uint32_t budgetMicroseconds_local;
  VL53L0X *this_local;
  
  if (budgetMicroseconds < 20000) {
    this_local._7_1_ = false;
  }
  else {
    getSequenceStepEnables
              (this,(VL53L0XSequenceStepEnables *)((long)&timeouts.preRangeMicroseconds + 3));
    getSequenceStepTimeouts
              (this,(VL53L0XSequenceStepEnables *)((long)&timeouts.preRangeMicroseconds + 3),
               (VL53L0XSequenceStepTimeouts *)&finalRangeTimeoutMicroseconds);
    uStack_54 = 0x8e8;
    if ((timeouts.preRangeMicroseconds._3_1_ & 1) != 0) {
      uStack_54 = timeouts._4_4_ + 0xb36;
    }
    if ((timeouts.finalRangeMicroseconds._1_1_ & 1) == 0) {
      if (((byte)timeouts.finalRangeMicroseconds & 1) != 0) {
        uStack_54 = timeouts._4_4_ + 0x294 + uStack_54;
      }
    }
    else {
      uStack_54 = (timeouts._4_4_ + 0x2b2) * 2 + uStack_54;
    }
    if ((timeouts.finalRangeMicroseconds._2_1_ & 1) != 0) {
      uStack_54 = timeouts._8_4_ + 0x294 + uStack_54;
    }
    if ((timeouts.finalRangeMicroseconds._3_1_ & 1) != 0) {
      uStack_54 = uStack_54 + 0x226;
    }
    if (budgetMicroseconds < uStack_54) {
      this_local._7_1_ = false;
    }
    else {
      uVar1 = timeoutMicrosecondsToMclks
                        (budgetMicroseconds - uStack_54,finalRangeTimeoutMicroseconds._2_1_);
      local_5a = (uint16_t)uVar1;
      if ((timeouts.finalRangeMicroseconds._2_1_ & 1) != 0) {
        local_5a = local_5a + usedBudgetMicroseconds._2_2_;
      }
      value = encodeTimeout(local_5a);
      writeRegister16Bit(this,'q',value);
      *(uint32_t *)&(this->super_VL53LXX).field_0x6c = budgetMicroseconds;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool VL53L0X::setMeasurementTimingBudget(uint32_t budgetMicroseconds) {
	// note that these are different than values in get_
	uint16_t const START_OVERHEAD = 1320;
	uint16_t const END_OVERHEAD = 960;
	uint16_t const MSRC_OVERHEAD = 660;
	uint16_t const TCC_OVERHEAD = 590;
	uint16_t const DSS_OVERHEAD = 690;
	uint16_t const PRE_RANGE_OVERHEAD = 660;
	uint16_t const FINAL_RANGE_OVERHEAD = 550;
	uint32_t const MIN_TIMING_BUDGET = 20000;

	if (budgetMicroseconds < MIN_TIMING_BUDGET) {
		return false;
	}

	VL53L0XSequenceStepEnables enables;
	VL53L0XSequenceStepTimeouts timeouts;
	this->getSequenceStepEnables(&enables);
	this->getSequenceStepTimeouts(&enables, &timeouts);

	uint32_t usedBudgetMicroseconds = START_OVERHEAD + END_OVERHEAD;
	if (enables.tcc) {
		usedBudgetMicroseconds += (timeouts.msrcDssTccMicroseconds + TCC_OVERHEAD);
	}
	if (enables.dss) {
		usedBudgetMicroseconds += 2 * (timeouts.msrcDssTccMicroseconds + DSS_OVERHEAD);
	} else if (enables.msrc) {
		usedBudgetMicroseconds += (timeouts.msrcDssTccMicroseconds + MSRC_OVERHEAD);
	}
	if (enables.preRange) {
		usedBudgetMicroseconds += (timeouts.preRangeMicroseconds + PRE_RANGE_OVERHEAD);
	}
	if (enables.finalRange) {
		usedBudgetMicroseconds += FINAL_RANGE_OVERHEAD;
	}

	// "Note that the final range timeout is determined by the timing
	// budget and the sum of all other timeouts within the sequence.
	// If there is no room for the final range timeout, then an error
	// will be set. Otherwise the remaining time will be applied to
	// the final range."

	if (usedBudgetMicroseconds > budgetMicroseconds) {
		// "Requested timeout too small."
		return false;
	}

	uint32_t finalRangeTimeoutMicroseconds = budgetMicroseconds - usedBudgetMicroseconds;

	// set_sequence_step_timeout() begin
	// (SequenceStepId == VL53L0X_SEQUENCESTEP_FINAL_RANGE)

	// "For the final range timeout, the pre-range timeout
	// must be added. To do this both final and pre-range
	// timeouts must be expressed in macro periods MClks
	// because they have different vcsel periods."

	uint16_t finalRangeTimeoutMCLKs = timeoutMicrosecondsToMclks(finalRangeTimeoutMicroseconds, timeouts.finalRangeVCSELPeriodPCLKs);

	if (enables.preRange) {
		finalRangeTimeoutMCLKs += timeouts.preRangeMCLKs;
	}

	this->writeRegister16Bit(FINAL_RANGE_CONFIG_TIMEOUT_MACROP_HI, encodeTimeout(finalRangeTimeoutMCLKs));

	// set_sequence_step_timeout() end

	// store for internal reuse
	this->measurementTimingBudgetMicroseconds = budgetMicroseconds;

	return true;
}